

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ec_seckey_tweak_mul(secp256k1_context *ctx,uchar *seckey,uchar *tweak)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  ulong uVar38;
  long lVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  uint uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  bool bVar57;
  bool bVar58;
  undefined1 auVar59 [16];
  int overflow;
  int overflow_1;
  int local_c4;
  uchar *local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  uint64_t local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  undefined1 local_68 [16];
  secp256k1_scalar local_50;
  
  local_c4 = 0;
  if (seckey == (uchar *)0x0) {
    secp256k1_ec_seckey_tweak_mul_cold_2();
  }
  else {
    if (tweak != (uchar *)0x0) {
      secp256k1_scalar_set_b32(&local_50,tweak,&local_c4);
      secp256k1_scalar_set_b32((secp256k1_scalar *)local_b8,seckey,(int *)&local_98);
      bVar57 = (int)local_98 == 0;
      bVar36 = local_b8._8_8_ != 0;
      bVar37 = local_a8._8_8_ != 0;
      bVar34 = local_b8._0_8_ != 0;
      bVar35 = local_a8._0_8_ != 0;
      bVar58 = local_c4 == 0;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_b8._0_8_;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_50.d[0];
      uVar40 = SUB168(auVar1 * auVar17,8);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = uVar40;
      local_98 = SUB168(auVar1 * auVar17,0);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_b8._0_8_;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_50.d[1];
      auVar2 = auVar2 * auVar18;
      uVar46 = SUB168(auVar2 + auVar33,0);
      uVar51 = SUB168(auVar2 + auVar33,8);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_b8._8_8_;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_50.d[0];
      uVar41 = SUB168(auVar3 * auVar19,8);
      uVar38 = SUB168(auVar3 * auVar19,0);
      local_90 = uVar46 + uVar38;
      uVar38 = (ulong)CARRY8(uVar46,uVar38);
      uVar46 = uVar51 + uVar41;
      uVar52 = uVar46 + uVar38;
      uVar53 = (ulong)CARRY8(auVar2._8_8_,(ulong)CARRY8(uVar40,auVar2._0_8_)) +
               (ulong)(CARRY8(uVar51,uVar41) || CARRY8(uVar46,uVar38));
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_b8._0_8_;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_50.d[2];
      uVar42 = SUB168(auVar4 * auVar20,8);
      uVar38 = SUB168(auVar4 * auVar20,0);
      uVar40 = uVar52 + uVar38;
      uVar38 = (ulong)CARRY8(uVar52,uVar38);
      uVar41 = uVar53 + uVar42;
      uVar54 = uVar41 + uVar38;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_b8._8_8_;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_50.d[1];
      uVar43 = SUB168(auVar5 * auVar21,8);
      uVar46 = SUB168(auVar5 * auVar21,0);
      uVar52 = uVar40 + uVar46;
      uVar46 = (ulong)CARRY8(uVar40,uVar46);
      uVar51 = uVar54 + uVar43;
      uVar55 = uVar51 + uVar46;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_a8._0_8_;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_50.d[0];
      uVar44 = SUB168(auVar6 * auVar22,8);
      uVar40 = SUB168(auVar6 * auVar22,0);
      local_88 = uVar52 + uVar40;
      uVar40 = (ulong)CARRY8(uVar52,uVar40);
      uVar52 = uVar55 + uVar44;
      uVar56 = uVar52 + uVar40;
      uVar47 = (ulong)(CARRY8(uVar53,uVar42) || CARRY8(uVar41,uVar38)) +
               (ulong)(CARRY8(uVar54,uVar43) || CARRY8(uVar51,uVar46)) +
               (ulong)(CARRY8(uVar55,uVar44) || CARRY8(uVar52,uVar40));
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_b8._0_8_;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_50.d[3];
      uVar44 = SUB168(auVar7 * auVar23,8);
      uVar38 = SUB168(auVar7 * auVar23,0);
      uVar40 = uVar56 + uVar38;
      uVar38 = (ulong)CARRY8(uVar56,uVar38);
      uVar51 = uVar47 + uVar44;
      uVar56 = uVar51 + uVar38;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_b8._8_8_;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_50.d[2];
      uVar53 = SUB168(auVar8 * auVar24,8);
      uVar46 = SUB168(auVar8 * auVar24,0);
      uVar41 = uVar40 + uVar46;
      uVar46 = (ulong)CARRY8(uVar40,uVar46);
      uVar52 = uVar56 + uVar53;
      uVar48 = uVar52 + uVar46;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_a8._0_8_;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_50.d[1];
      uVar54 = SUB168(auVar9 * auVar25,8);
      uVar40 = SUB168(auVar9 * auVar25,0);
      uVar43 = uVar41 + uVar40;
      uVar40 = (ulong)CARRY8(uVar41,uVar40);
      uVar42 = uVar48 + uVar54;
      uVar49 = uVar42 + uVar40;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_a8._8_8_;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_50.d[0];
      uVar55 = SUB168(auVar10 * auVar26,8);
      uVar41 = SUB168(auVar10 * auVar26,0);
      local_80 = uVar43 + uVar41;
      uVar41 = (ulong)CARRY8(uVar43,uVar41);
      uVar43 = uVar49 + uVar55;
      uVar50 = uVar43 + uVar41;
      uVar53 = (ulong)(CARRY8(uVar47,uVar44) || CARRY8(uVar51,uVar38)) +
               (ulong)(CARRY8(uVar56,uVar53) || CARRY8(uVar52,uVar46)) +
               (ulong)(CARRY8(uVar48,uVar54) || CARRY8(uVar42,uVar40)) +
               (ulong)(CARRY8(uVar49,uVar55) || CARRY8(uVar43,uVar41));
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_b8._8_8_;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_50.d[3];
      uVar42 = SUB168(auVar11 * auVar27,8);
      uVar38 = SUB168(auVar11 * auVar27,0);
      uVar40 = uVar50 + uVar38;
      uVar38 = (ulong)CARRY8(uVar50,uVar38);
      uVar41 = uVar53 + uVar42;
      uVar54 = uVar41 + uVar38;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_a8._0_8_;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_50.d[2];
      uVar43 = SUB168(auVar12 * auVar28,8);
      uVar46 = SUB168(auVar12 * auVar28,0);
      uVar52 = uVar40 + uVar46;
      uVar46 = (ulong)CARRY8(uVar40,uVar46);
      uVar51 = uVar54 + uVar43;
      uVar55 = uVar51 + uVar46;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_a8._8_8_;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_50.d[1];
      uVar44 = SUB168(auVar13 * auVar29,8);
      uVar40 = SUB168(auVar13 * auVar29,0);
      local_78 = uVar52 + uVar40;
      uVar40 = (ulong)CARRY8(uVar52,uVar40);
      uVar52 = uVar55 + uVar44;
      uVar47 = uVar52 + uVar40;
      uVar42 = (ulong)(CARRY8(uVar53,uVar42) || CARRY8(uVar41,uVar38)) +
               (ulong)(CARRY8(uVar54,uVar43) || CARRY8(uVar51,uVar46)) +
               (ulong)(CARRY8(uVar55,uVar44) || CARRY8(uVar52,uVar40));
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_a8._0_8_;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_50.d[3];
      uVar51 = SUB168(auVar14 * auVar30,8);
      uVar38 = SUB168(auVar14 * auVar30,0);
      uVar41 = uVar47 + uVar38;
      uVar38 = (ulong)CARRY8(uVar47,uVar38);
      uVar40 = uVar42 + uVar51;
      uVar43 = uVar40 + uVar38;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_a8._8_8_;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = local_50.d[2];
      uVar52 = SUB168(auVar15 * auVar31,8);
      uVar46 = SUB168(auVar15 * auVar31,0);
      local_70 = uVar41 + uVar46;
      uVar46 = (ulong)CARRY8(uVar41,uVar46);
      uVar41 = uVar43 + uVar52;
      local_68._8_8_ =
           (ulong)(CARRY8(uVar42,uVar51) || CARRY8(uVar40,uVar38)) +
           (ulong)(CARRY8(uVar43,uVar52) || CARRY8(uVar41,uVar46));
      local_68._0_8_ = uVar41 + uVar46;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_a8._8_8_;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = local_50.d[3];
      local_68 = auVar16 * auVar32 + local_68;
      local_c0 = seckey;
      secp256k1_scalar_reduce_512((secp256k1_scalar *)local_b8,&local_98);
      uVar45 = (uint)((((local_50.d[3] != 0 || local_50.d[1] != 0) ||
                       (local_50.d[2] != 0 || local_50.d[0] != 0)) && bVar58) &&
                     (((bVar36 || bVar37) || (bVar34 || bVar35)) && bVar57));
      lVar39 = (ulong)(uVar45 ^ 1) - 1;
      auVar59._8_4_ = (int)lVar39;
      auVar59._0_8_ = lVar39;
      auVar59._12_4_ = (int)((ulong)lVar39 >> 0x20);
      local_b8 = local_b8 & auVar59;
      local_a8 = auVar59 & local_a8;
      secp256k1_scalar_get_b32(local_c0,(secp256k1_scalar *)local_b8);
      return uVar45;
    }
    secp256k1_ec_seckey_tweak_mul_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_ec_seckey_tweak_mul(const secp256k1_context* ctx, unsigned char *seckey, const unsigned char *tweak) {
    secp256k1_scalar factor;
    secp256k1_scalar sec;
    int ret = 0;
    int overflow = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);
    ARG_CHECK(tweak != NULL);

    secp256k1_scalar_set_b32(&factor, tweak, &overflow);
    ret = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    ret &= (!overflow) & secp256k1_eckey_privkey_tweak_mul(&sec, &factor);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_get_b32(seckey, &sec);

    secp256k1_scalar_clear(&sec);
    secp256k1_scalar_clear(&factor);
    return ret;
}